

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Request * __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::request
          (Request *__return_storage_ptr__,ConcurrencyLimitingHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  SourceLocation location;
  SourceLocation location_00;
  OwnPromiseNode node;
  undefined8 uVar1;
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *pPVar2;
  PromiseBase PVar3;
  PromiseArenaMember *pPVar4;
  void *pvVar5;
  int __flags;
  char *pcVar6;
  char *pcVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  Request *this_00;
  PromiseArena *pPVar8;
  void *__arg;
  size_t sVar9;
  TransformPromiseNodeBase *this_01;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6509:15),_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  combined;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  split;
  String urlCopy;
  HttpHeaders headersCopy;
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  OwnPromiseNode local_190;
  undefined1 local_188 [16];
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *local_178;
  PromiseBase local_170;
  PromiseArenaMember *local_168;
  PromiseBase local_160;
  PromiseArena *pPStack_158;
  _Elt_pointer pOStack_150;
  HttpHeaders local_148;
  char local_e8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_e0;
  String local_d8;
  Request *local_c0;
  HttpHeaders local_b8;
  char *local_58;
  char *pcStack_50;
  undefined8 local_48;
  char local_40 [8];
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_38;
  
  pvVar5 = (void *)url.content.size_;
  pcVar6 = url.content.ptr;
  local_c0 = __return_storage_ptr__;
  if (this->concurrentRequests < this->maxConcurrentRequests) {
    this->concurrentRequests = this->concurrentRequests + 1;
    local_40[0] = (expectedBodySize->ptr).isSet;
    if ((bool)local_40[0] == true) {
      local_38 = (expectedBodySize->ptr).field_1;
    }
    local_b8.table = (HttpHeaderTable *)this;
    (**this->inner->_vptr_HttpClient)
              (&local_170,this->inner,(ulong)method,pcVar6,pvVar5,headers,local_40);
    fireCountChanged(this);
    this_00 = local_c0;
    attachCounter((ConcurrencyLimitingHttpClient *)local_188,
                  (Promise<kj::HttpClient::Response> *)&local_160,(ConnectionCounter *)&local_b8);
    PVar3.node.ptr = local_160.node.ptr;
    (this_00->body).disposer = (Disposer *)local_170.node.ptr;
    (this_00->body).ptr = (AsyncOutputStream *)local_168;
    local_168 = (PromiseArenaMember *)0x0;
    (this_00->response).super_PromiseBase.node.ptr = (PromiseNode *)local_188._0_8_;
    if (local_160.node.ptr != (PromiseNode *)0x0) {
      local_160.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar3.node.ptr);
    }
    pPVar4 = local_168;
    if (local_168 != (PromiseArenaMember *)0x0) {
      local_168 = (PromiseArenaMember *)0x0;
      (***(_func_int ***)local_170.node.ptr)
                (local_170.node.ptr,(Iface *)((long)pPVar4 + *(long *)(*(long *)pPVar4 + -0x10)));
    }
    ConnectionCounter::~ConnectionCounter((ConnectionCounter *)&local_b8);
  }
  else {
    location.function = (char *)in_stack_fffffffffffffe50;
    location.fileName = (char *)in_stack_fffffffffffffe48;
    location._16_8_ = in_stack_fffffffffffffe58;
    pcVar7 = pcVar6;
    __arg = pvVar5;
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              ((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                *)local_188,location);
    __flags = (int)pcVar7;
    sVar9 = (long)pvVar5 - 1;
    heapString(&local_d8,sVar9);
    pvVar5 = extraout_RDX;
    if (sVar9 != 0) {
      pPVar8 = (PromiseArena *)local_d8.content.size_;
      if ((PromiseArena *)local_d8.content.size_ != (PromiseArena *)0x0) {
        pPVar8 = (PromiseArena *)local_d8.content.ptr;
      }
      memcpy(pPVar8,pcVar6,sVar9);
      pvVar5 = extraout_RDX_00;
    }
    HttpHeaders::clone(&local_b8,(__fn *)headers,pvVar5,__flags,__arg);
    uVar1 = local_188._0_8_;
    local_168 = (PromiseArenaMember *)CONCAT44(local_168._4_4_,method);
    local_160.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_d8.content.ptr;
    pPStack_158 = (PromiseArena *)local_d8.content.size_;
    pOStack_150 = (_Elt_pointer)local_d8.content.disposer;
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    local_148.table = local_b8.table;
    local_148.indexedHeaders.ptr = local_b8.indexedHeaders.ptr;
    local_148.indexedHeaders.size_ = local_b8.indexedHeaders.size_;
    local_148.indexedHeaders.disposer = local_b8.indexedHeaders.disposer;
    local_b8.indexedHeaders.ptr = (StringPtr *)0x0;
    local_b8.indexedHeaders.size_ = 0;
    local_148.unindexedHeaders.builder.ptr = local_b8.unindexedHeaders.builder.ptr;
    local_148.unindexedHeaders.builder.pos = local_b8.unindexedHeaders.builder.pos;
    local_148.unindexedHeaders.builder.endPtr = local_b8.unindexedHeaders.builder.endPtr;
    local_148.unindexedHeaders.builder.disposer = local_b8.unindexedHeaders.builder.disposer;
    local_b8.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_b8.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    local_b8.unindexedHeaders.builder.endPtr = (Header *)0x0;
    local_148.ownedStrings.builder.ptr = local_b8.ownedStrings.builder.ptr;
    local_148.ownedStrings.builder.pos = local_b8.ownedStrings.builder.pos;
    local_148.ownedStrings.builder.endPtr = local_b8.ownedStrings.builder.endPtr;
    local_148.ownedStrings.builder.disposer = local_b8.ownedStrings.builder.disposer;
    local_b8.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_b8.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    local_b8.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    local_e8 = (expectedBodySize->ptr).isSet;
    if ((bool)local_e8 == true) {
      local_e0 = (expectedBodySize->ptr).field_1;
    }
    pPVar8 = *(PromiseArena **)(local_188._0_8_ + 8);
    local_170.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
    if (pPVar8 == (PromiseArena *)0x0 || (ulong)(local_188._0_8_ - (long)pPVar8) < 0xb8) {
      pvVar5 = operator_new(0x400);
      this_01 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x348);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,(OwnPromiseNode *)local_188,
                 kj::_::
                 SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6509:15)>
                 ::anon_class_152_5_1d7fcda0_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x348) = &PTR_destroy_00704e20;
      ((OwnPromiseNode *)((long)pvVar5 + 0x368))->ptr = (PromiseNode *)local_170.node.ptr;
      *(undefined4 *)((long)pvVar5 + 0x370) = local_168._0_4_;
      *(OwnPromiseNode *)((long)pvVar5 + 0x378) = local_160.node.ptr;
      *(PromiseArena **)((long)pvVar5 + 0x380) = pPStack_158;
      *(_Elt_pointer *)((long)pvVar5 + 0x388) = pOStack_150;
      *(HttpHeaderTable **)((long)pvVar5 + 0x390) = local_148.table;
      *(StringPtr **)((long)pvVar5 + 0x398) = local_148.indexedHeaders.ptr;
      *(size_t *)((long)pvVar5 + 0x3a0) = local_148.indexedHeaders.size_;
      *(ArrayDisposer **)((long)pvVar5 + 0x3a8) = local_148.indexedHeaders.disposer;
      *(Header **)((long)pvVar5 + 0x3b0) = local_148.unindexedHeaders.builder.ptr;
      *(RemoveConst<kj::HttpHeaders::Header> **)((long)pvVar5 + 0x3b8) =
           local_148.unindexedHeaders.builder.pos;
      *(Header **)((long)pvVar5 + 0x3c0) = local_148.unindexedHeaders.builder.endPtr;
      *(ArrayDisposer **)((long)pvVar5 + 0x3c8) = local_148.unindexedHeaders.builder.disposer;
      *(Array<char> **)((long)pvVar5 + 0x3d0) = local_148.ownedStrings.builder.ptr;
      *(RemoveConst<kj::Array<char>_> **)((long)pvVar5 + 0x3d8) = local_148.ownedStrings.builder.pos
      ;
      *(Array<char> **)((long)pvVar5 + 0x3e0) = local_148.ownedStrings.builder.endPtr;
      *(ArrayDisposer **)((long)pvVar5 + 1000) = local_148.ownedStrings.builder.disposer;
      *(char *)((long)pvVar5 + 0x3f0) = local_e8;
      if (local_e8 == '\x01') {
        *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)((long)pvVar5 + 0x3f8) =
             local_e0;
        local_e8 = '\0';
      }
      *(void **)((long)pvVar5 + 0x350) = pvVar5;
    }
    else {
      *(PromiseArena **)(local_188._0_8_ + 8) = (PromiseArena *)0x0;
      this_01 = (TransformPromiseNodeBase *)(local_188._0_8_ + -0xb8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,(OwnPromiseNode *)local_188,
                 kj::_::
                 SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6509:15)>
                 ::anon_class_152_5_1d7fcda0_for_func::operator());
      *(undefined ***)(uVar1 + -0xb8) = &PTR_destroy_00704e20;
      *(OwnPromiseNode *)(uVar1 + -0x98) = local_170.node.ptr;
      *(undefined4 *)
       &((PromiseArenaMember *)&((PromiseArenaMember *)(uVar1 + -0x90))->_vptr_PromiseArenaMember)->
        _vptr_PromiseArenaMember = local_168._0_4_;
      *(OwnPromiseNode *)(uVar1 + -0x88) = local_160.node.ptr;
      ((PromiseArenaMember *)&((PromiseArenaMember *)(uVar1 + -0x80))->_vptr_PromiseArenaMember)->
      _vptr_PromiseArenaMember = (_func_int **)pPStack_158;
      *(_Elt_pointer *)(uVar1 + -0x78) = pOStack_150;
      ((PromiseArenaMember *)&((PromiseArenaMember *)(uVar1 + -0x70))->_vptr_PromiseArenaMember)->
      _vptr_PromiseArenaMember = (_func_int **)local_148.table;
      *(StringPtr **)(uVar1 + -0x68) = local_148.indexedHeaders.ptr;
      ((PromiseArenaMember *)&((PromiseArenaMember *)(uVar1 + -0x60))->_vptr_PromiseArenaMember)->
      _vptr_PromiseArenaMember = (_func_int **)local_148.indexedHeaders.size_;
      *(ArrayDisposer **)(uVar1 + -0x58) = local_148.indexedHeaders.disposer;
      ((PromiseArenaMember *)&((PromiseArenaMember *)(uVar1 + -0x50))->_vptr_PromiseArenaMember)->
      _vptr_PromiseArenaMember = (_func_int **)local_148.unindexedHeaders.builder.ptr;
      *(RemoveConst<kj::HttpHeaders::Header> **)(uVar1 + -0x48) =
           local_148.unindexedHeaders.builder.pos;
      ((PromiseArenaMember *)&((PromiseArenaMember *)(uVar1 + -0x40))->_vptr_PromiseArenaMember)->
      _vptr_PromiseArenaMember = (_func_int **)local_148.unindexedHeaders.builder.endPtr;
      *(ArrayDisposer **)(uVar1 + -0x38) = local_148.unindexedHeaders.builder.disposer;
      ((PromiseArenaMember *)&((PromiseArenaMember *)(uVar1 + -0x30))->_vptr_PromiseArenaMember)->
      _vptr_PromiseArenaMember = (_func_int **)local_148.ownedStrings.builder.ptr;
      *(RemoveConst<kj::Array<char>_> **)(uVar1 + -0x28) = local_148.ownedStrings.builder.pos;
      ((PromiseArenaMember *)&((PromiseArenaMember *)(uVar1 + -0x20))->_vptr_PromiseArenaMember)->
      _vptr_PromiseArenaMember = (_func_int **)local_148.ownedStrings.builder.endPtr;
      *(ArrayDisposer **)(uVar1 + -0x18) = local_148.ownedStrings.builder.disposer;
      *(char *)&((PromiseArenaMember *)
                &((PromiseArenaMember *)(uVar1 + -0x10))->_vptr_PromiseArenaMember)->
                _vptr_PromiseArenaMember = local_e8;
      if (local_e8 == '\x01') {
        *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(uVar1 + -8) = local_e0;
        local_e8 = '\0';
      }
      ((PromiseArenaMember *)&((PromiseArenaMember *)(uVar1 + -0xb0))->_vptr_PromiseArenaMember)->
      _vptr_PromiseArenaMember = (_func_int **)pPVar8;
    }
    local_148.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    local_148.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    local_148.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_148.unindexedHeaders.builder.endPtr = (Header *)0x0;
    local_148.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    local_148.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_148.indexedHeaders.size_ = 0;
    local_148.indexedHeaders.ptr = (StringPtr *)0x0;
    pPStack_158 = (PromiseArena *)0x0;
    local_160.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    HttpHeaders::~HttpHeaders(&local_148);
    this_00 = local_c0;
    pPVar8 = pPStack_158;
    PVar3.node.ptr = local_160.node.ptr;
    if (local_160.node.ptr != (PromiseNode *)0x0) {
      local_160.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      pPStack_158 = (PromiseArena *)0x0;
      (*(code *)pOStack_150->disposer->_vptr_Disposer)(pOStack_150,PVar3.node.ptr,1,pPVar8,pPVar8,0)
      ;
    }
    local_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    pcStack_50 = "request";
    local_48 = 0x1200001975;
    location_00.function = "request";
    location_00.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location_00.lineNumber = 0x1975;
    location_00.columnNumber = 0x12;
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
    ::split((Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>,_kj::Promise<kj::HttpClient::Response>_>_>
             *)&local_170,location_00);
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>_>
    ::push(&this->pendingRequests,(value_type *)(local_188 + 8));
    fireCountChanged(this);
    local_190.ptr = (PromiseNode *)local_170.node.ptr;
    local_170.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    newPromisedStream((kj *)this_00,
                      (Promise<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_> *)&local_190);
    node.ptr = local_190.ptr;
    (this_00->response).super_PromiseBase.node.ptr = (PromiseNode *)local_168;
    local_168 = (PromiseArenaMember *)0x0;
    if ((ConcurrencyLimitingHttpClient *)local_190.ptr != (ConcurrencyLimitingHttpClient *)0x0) {
      local_190.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    pPVar4 = local_168;
    if (local_168 != (PromiseArenaMember *)0x0) {
      local_168 = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar4);
    }
    PVar3.node.ptr = local_170.node.ptr;
    if (local_170.node.ptr != (PromiseNode *)0x0) {
      local_170.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar3.node.ptr);
    }
    if (this_01 != (TransformPromiseNodeBase *)0x0) {
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)this_01);
    }
    HttpHeaders::~HttpHeaders(&local_b8);
    sVar9 = local_d8.content.size_;
    pcVar6 = local_d8.content.ptr;
    if (local_d8.content.ptr != (char *)0x0) {
      local_d8.content.ptr = (char *)0x0;
      local_d8.content.size_ = 0;
      (*(code *)((Disposer *)(local_d8.content.disposer)->_vptr_ArrayDisposer)->_vptr_Disposer)
                (local_d8.content.disposer,pcVar6,1,sVar9,sVar9,0);
    }
    pPVar2 = local_178;
    if (local_178 !=
        (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
         *)0x0) {
      local_178 = (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                   *)0x0;
      (***(_func_int ***)local_188._8_8_)
                (local_188._8_8_,
                 (_func_int *)
                 ((long)&(pPVar2->super_PromiseRejector)._vptr_PromiseRejector +
                 (long)(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[-2]));
    }
    uVar1 = local_188._0_8_;
    if ((PromiseArenaMember *)local_188._0_8_ != (PromiseArenaMember *)0x0) {
      local_188._0_8_ = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
    }
  }
  return this_00;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto request = inner.request(method, url, headers, expectedBodySize);
      fireCountChanged();
      auto promise = attachCounter(kj::mv(request.response), kj::mv(counter));
      return { kj::mv(request.body), kj::mv(promise) };
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();
    auto urlCopy = kj::str(url);
    auto headersCopy = headers.clone();

    auto combined = paf.promise
        .then([this,
               method,
               urlCopy = kj::mv(urlCopy),
               headersCopy = kj::mv(headersCopy),
               expectedBodySize](ConnectionCounter&& counter) mutable {
      auto req = inner.request(method, urlCopy, headersCopy, expectedBodySize);
      return kj::tuple(kj::mv(req.body), attachCounter(kj::mv(req.response), kj::mv(counter)));
    });
    auto split = combined.split();
    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();
    return { newPromisedStream(kj::mv(kj::get<0>(split))), kj::mv(kj::get<1>(split)) };
  }